

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O1

UBool __thiscall
icu_63::StringCharacterIterator::operator==
          (StringCharacterIterator *this,ForwardCharacterIterator *that)

{
  ushort uVar1;
  short sVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (this == (StringCharacterIterator *)that) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_UCharCharacterIterator).super_CharacterIterator.
                    super_ForwardCharacterIterator.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((__s1 == __s2) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)))) {
    uVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->text).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = *(short *)&that[5].super_UObject._vptr_UObject;
      if (sVar2 < 0) {
        iVar5 = *(int *)((long)&that[5].super_UObject._vptr_UObject + 4);
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      bVar6 = false;
      if ((((int)sVar2 & 1U) == 0) && (bVar6 = false, iVar4 == iVar5)) {
        UVar3 = UnicodeString::doEquals(&this->text,(UnicodeString *)(that + 4),iVar4);
        bVar6 = UVar3 != '\0';
      }
    }
    else {
      bVar6 = (bool)(*(byte *)&that[5].super_UObject._vptr_UObject & 1);
    }
    if (((bVar6 != false) &&
        ((this->super_UCharCharacterIterator).super_CharacterIterator.pos ==
         *(int *)((long)&that[1].super_UObject._vptr_UObject + 4))) &&
       ((this->super_UCharCharacterIterator).super_CharacterIterator.begin ==
        *(int *)&that[2].super_UObject._vptr_UObject)) {
      return (this->super_UCharCharacterIterator).super_CharacterIterator.end ==
             *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
    }
  }
  return '\0';
}

Assistant:

UBool
StringCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }

    // do not call UCharCharacterIterator::operator==()
    // because that checks for array pointer equality
    // while we compare UnicodeString objects

    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    StringCharacterIterator&    realThat = (StringCharacterIterator&)that;

    return text == realThat.text
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}